

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# folding_rules.cpp
# Opt level: O0

bool spvtools::opt::anon_unknown_0::DoInsertedValuesCoverEntireObject
               (Type *type,
               map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
               *values_inserted)

{
  ulong uVar1;
  size_type sVar2;
  pointer ppVar3;
  reverse_iterator<std::_Rb_tree_iterator<std::pair<const_unsigned_int,_unsigned_int>_>_> local_30;
  uint32_t local_24;
  _Base_ptr p_Stack_20;
  uint32_t container_size;
  map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
  *values_inserted_local;
  Type *type_local;
  
  p_Stack_20 = (_Base_ptr)values_inserted;
  values_inserted_local =
       (map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
        *)type;
  local_24 = GetNumberOfElements(type);
  uVar1 = (ulong)local_24;
  sVar2 = std::
          map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
          ::size((map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                  *)p_Stack_20);
  if (uVar1 == sVar2) {
    std::
    map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
    ::rbegin((map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
              *)&local_30);
    ppVar3 = std::
             reverse_iterator<std::_Rb_tree_iterator<std::pair<const_unsigned_int,_unsigned_int>_>_>
             ::operator->(&local_30);
    if (ppVar3->first < local_24) {
      type_local._7_1_ = true;
    }
    else {
      type_local._7_1_ = false;
    }
  }
  else {
    type_local._7_1_ = false;
  }
  return type_local._7_1_;
}

Assistant:

bool DoInsertedValuesCoverEntireObject(
    const analysis::Type* type, std::map<uint32_t, uint32_t>& values_inserted) {
  uint32_t container_size = GetNumberOfElements(type);
  if (container_size != values_inserted.size()) {
    return false;
  }

  if (values_inserted.rbegin()->first >= container_size) {
    return false;
  }
  return true;
}